

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleErrorsTest::StorageMultisampleErrorsTest
          (StorageMultisampleErrorsTest *this,Context *context)

{
  deqp::TestCase::TestCase
            (&this->super_TestCase,context,"renderbuffers_storage_multisample_errors",
             "Storage Multisample Errors Test");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01ddfab0;
  this->m_rbo_valid = 0;
  this->m_rbo_invalid = 0;
  this->m_internalformat_invalid = 0;
  this->m_max_samples = 0;
  this->m_max_integer_samples = 0;
  return;
}

Assistant:

StorageMultisampleErrorsTest::StorageMultisampleErrorsTest(deqp::Context& context)
	: deqp::TestCase(context, "renderbuffers_storage_multisample_errors", "Storage Multisample Errors Test")
	, m_rbo_valid(0)
	, m_rbo_invalid(0)
	, m_internalformat_invalid(0)
	, m_max_samples(0)
	, m_max_integer_samples(0)
{
	/* Intentionally left blank. */
}